

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O0

QJsonDocument * __thiscall QJsonDocument::operator=(QJsonDocument *this,QJsonDocument *other)

{
  long lVar1;
  bool bVar2;
  QCborValue *this_00;
  QJsonDocument *in_RSI;
  QJsonDocument *in_RDI;
  long in_FS_OFFSET;
  QCborValue *in_stack_ffffffffffffffc8;
  unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>
  *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI != in_RSI) {
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>
                        *)0x48e40b);
    if (bVar2) {
      bVar2 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>
                          *)0x48e41b);
      if (!bVar2) {
        std::make_unique<QJsonDocumentPrivate>();
        std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::operator=
                  (in_stack_ffffffffffffffd0,
                   (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)
                   in_stack_ffffffffffffffc8);
        std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::
        ~unique_ptr(in_stack_ffffffffffffffd0);
      }
      this_00 = &std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::
                 operator->((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>
                             *)0x48e44c)->value;
      std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::operator->
                ((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)
                 0x48e45b);
      ::QCborValue::operator=(this_00,in_stack_ffffffffffffffc8);
    }
    else {
      std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::reset
                (in_stack_ffffffffffffffd0,(pointer)in_stack_ffffffffffffffc8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QJsonDocument &QJsonDocument::operator =(const QJsonDocument &other)
{
    if (this != &other) {
        if (other.d) {
            if (!d)
                d = std::make_unique<QJsonDocumentPrivate>();
            d->value = other.d->value;
        } else {
            d.reset();
        }
    }
    return *this;
}